

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_semacheck2.c
# Opt level: O0

_Bool node_canbe_superclass(gnode_t *node)

{
  gnode_var_t *var_1;
  gnode_variable_decl_t *var;
  gnode_t *node_local;
  
  if ((node == (gnode_t *)0x0) || (node->tag != NODE_CLASS_DECL)) {
    if ((node == (gnode_t *)0x0) || (node->tag != NODE_VARIABLE_DECL)) {
      if ((node == (gnode_t *)0x0) || (node->tag != NODE_VARIABLE)) {
        node_local._7_1_ = false;
      }
      else {
        node_local._7_1_ = *(int *)(*(long *)&node[1].token.fileid + 0x50) == 0x1f;
      }
    }
    else {
      node_local._7_1_ = node[1].block_length == 0x1f;
    }
  }
  else {
    node_local._7_1_ = true;
  }
  return node_local._7_1_;
}

Assistant:

static bool node_canbe_superclass (gnode_t *node) {
    if (NODE_ISA(node, NODE_CLASS_DECL)) return true;
    
    if (NODE_ISA(node, NODE_VARIABLE_DECL)) {
        // extern var can be superclass
        // if not a real class the error will be triggered at runtime
        gnode_variable_decl_t *var = (gnode_variable_decl_t *)node;
        return (var->storage == TOK_KEY_EXTERN);
    }
    
    if (NODE_ISA(node, NODE_VARIABLE)) {
        // extern var can be superclass
        // if not a real class the error will be triggered at runtime
        gnode_var_t *var = (gnode_var_t *)node;
        return (var->vdecl->storage == TOK_KEY_EXTERN);
    }
    
    return false;
}